

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

JSONNode __thiscall JSONNode::dump(JSONNode *this,size_t *totalmemory)

{
  size_t sVar1;
  allocator local_51;
  JSONNode local_50;
  
  sVar1 = *totalmemory;
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,"no internal",(allocator *)&local_50);
  JSONDebug::_JSON_ASSERT(sVar1 != 0,(json_string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  JSONNode(this,'\x05');
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"this",&local_51);
  JSONNode(&local_50,(json_string *)&stack0xffffffffffffffb8,(long)totalmemory);
  push_back(this,&local_50);
  ~JSONNode(&local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"bytes used",&local_51);
  JSONNode(&local_50,(json_string *)&stack0xffffffffffffffb8,8);
  push_back(this,&local_50);
  ~JSONNode(&local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  internalJSONNode::Dump((internalJSONNode *)&stack0xffffffffffffffb8,(size_t *)*totalmemory);
  push_back(this,(JSONNode *)&stack0xffffffffffffffb8);
  ~JSONNode((JSONNode *)&stack0xffffffffffffffb8);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

inline JSONNode JSONNode::dump(size_t & totalmemory) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSONNode dumpage(JSON_NODE);
		  dumpage.push_back(JSON_NEW(JSONNode(JSON_TEXT("this"), (long)this)));
		  dumpage.push_back(JSON_NEW(JSONNode(JSON_TEXT("bytes used"), sizeof(JSONNode))));
		  dumpage.push_back(JSON_NEW(internal -> Dump(totalmemory)));
		  return dumpage;
	   }